

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_util.h
# Opt level: O0

int compute_sampled_lines(int height,int y_sampling,int start_y)

{
  int iVar1;
  int end;
  int start;
  int nlines;
  int start_y_local;
  int y_sampling_local;
  int height_local;
  int local_4;
  
  local_4 = height;
  if (1 < y_sampling) {
    if (height == 1) {
      nlines = (int)(start_y % y_sampling == 0);
    }
    else {
      start = start_y;
      if (start_y % y_sampling != 0) {
        start = start_y + (y_sampling - start_y % y_sampling);
      }
      iVar1 = start_y + height + -1;
      iVar1 = iVar1 - iVar1 % y_sampling;
      if (iVar1 < start) {
        nlines = 0;
      }
      else {
        nlines = (iVar1 - start) / y_sampling + 1;
      }
    }
    local_4 = nlines;
  }
  return local_4;
}

Assistant:

OPENEXR_CORE_INTERNAL_NAMESPACE_SOURCE_ENTER

static inline int
compute_sampled_lines (int height, int y_sampling, int start_y)
{
    int nlines;

    if (y_sampling <= 1) return height;

    if (height == 1)
        nlines = (start_y % y_sampling) == 0 ? 1 : 0;
    else
    {
        int start, end;

        /* computed the number of times y % ysampling == 0, by
         * computing interval based on first and last time that occurs
         * on the given range
         */
        start = start_y % y_sampling;
        if (start != 0)
            start = start_y + (y_sampling - start);
        else
            start = start_y;
        end = start_y + height - 1;
        end -= (end % y_sampling);

        if (start > end)
            nlines = 0;
        else
            nlines = (end - start) / y_sampling + 1;
    }

    return nlines;
}